

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.hpp
# Opt level: O0

istream * utility::read<std::vector<signed_char,std::allocator<signed_char>>>
                    (istream *stream,vector<signed_char,_std::allocator<signed_char>_> *values)

{
  size_t this;
  bool bVar1;
  istream *piVar2;
  long local_48;
  int64_t n;
  char *value;
  iterator __end0;
  iterator __begin0;
  vector<signed_char,_std::allocator<signed_char>_> *__range3;
  size_t size;
  vector<signed_char,_std::allocator<signed_char>_> *values_local;
  istream *stream_local;
  
  __range3 = (vector<signed_char,_std::allocator<signed_char>_> *)0x0;
  size = (size_t)values;
  values_local = (vector<signed_char,_std::allocator<signed_char>_> *)stream;
  piVar2 = burst::trivial_read_fn::operator()
                     ((trivial_read_fn *)&burst::trivial_read,stream,(unsigned_long *)&__range3);
  bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar2 + *(long *)(*(long *)piVar2 + -0x18)));
  if (bVar1) {
    std::vector<signed_char,_std::allocator<signed_char>_>::resize
              ((vector<signed_char,_std::allocator<signed_char>_> *)size,(size_type)__range3);
    this = size;
    __end0 = std::vector<signed_char,_std::allocator<signed_char>_>::begin
                       ((vector<signed_char,_std::allocator<signed_char>_> *)size);
    value = (char *)std::vector<signed_char,_std::allocator<signed_char>_>::end
                              ((vector<signed_char,_std::allocator<signed_char>_> *)this);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end0,(__normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>
                                       *)&value), bVar1) {
      n = (int64_t)__gnu_cxx::
                   __normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>
                   ::operator*(&__end0);
      local_48 = 0;
      burst::trivial_read_fn::operator()
                ((trivial_read_fn *)&burst::trivial_read,(istream *)values_local,&local_48);
      *(char *)n = (char)local_48;
      __gnu_cxx::
      __normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>::
      operator++(&__end0);
    }
  }
  return (istream *)values_local;
}

Assistant:

std::istream & read (std::istream & stream, Container & values)
    {
        auto size = std::size_t{};
        if (burst::trivial_read(stream, size))
        {
            values.resize(size);

            for (auto & value: values)
            {
                auto n = std::int64_t{};
                burst::trivial_read(stream, n);
                value = static_cast<typename Container::value_type>(n);
            }
        }

        return stream;
    }